

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O2

Gia_Man_t * Gia_ManFramesInit(Gia_Man_t *pAig,Gia_ParFra_t *pPars)

{
  Vec_Vec_t *p;
  Vec_Vec_t *p_00;
  Vec_Vec_t *p_01;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_ManFra_t *p_02;
  Gia_Man_t *p_03;
  char *pcVar6;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  Vec_Int_t *p_06;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_07;
  uint uVar9;
  
  p_02 = Gia_ManFraStart(pAig,pPars);
  Gia_ManFraSupports(p_02);
  p = (Vec_Vec_t *)p_02->vIns;
  iVar1 = Vec_VecSizeSize(p);
  p_00 = (Vec_Vec_t *)p_02->vAnds;
  iVar2 = Vec_VecSizeSize(p_00);
  p_01 = (Vec_Vec_t *)p_02->vOuts;
  iVar3 = Vec_VecSizeSize(p_01);
  p_03 = Gia_ManStart(iVar1 + iVar2 + iVar3);
  pcVar6 = Abc_UtilStrsav(pAig->pName);
  p_03->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(pAig->pSpec);
  p_03->pSpec = pcVar6;
  Gia_ManHashAlloc(p_03);
  pAig->pObjs->Value = 0;
  uVar9 = 0;
  do {
    if (pPars->nFrames <= (int)uVar9) {
      Gia_ManFraStop(p_02);
      Gia_ManHashStop(p_03);
      iVar1 = Gia_ManCombMarkUsed(p_03);
      uVar9 = Gia_ManAndNum(p_03);
      if (iVar1 < (int)uVar9) {
        p_07 = Gia_ManDupMarked(p_03);
        if (pPars->fVerbose != 0) {
          uVar9 = Gia_ManAndNum(p_03);
          uVar4 = Gia_ManAndNum(p_07);
          printf("Before cleanup = %d nodes. After cleanup = %d nodes.\n",(ulong)uVar9,(ulong)uVar4)
          ;
        }
        Gia_ManStop(p_03);
        p_03 = p_07;
      }
      else if (pPars->fVerbose != 0) {
        printf("Before cleanup = %d nodes. After cleanup = %d nodes.\n",(ulong)uVar9,(ulong)uVar9);
      }
      return p_03;
    }
    p_04 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)p,uVar9);
    p_05 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,uVar9);
    p_06 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)p_01,uVar9);
    if (pPars->fVerbose != 0) {
      printf("Frame %3d : CI = %6d. AND = %6d. CO = %6d.\n",(ulong)uVar9,(ulong)(uint)p_04->nSize,
             (ulong)(uint)p_05->nSize,(ulong)(uint)p_06->nSize);
    }
    iVar1 = 0;
    while ((iVar1 < pAig->vCis->nSize - pAig->nRegs &&
           (pGVar7 = Gia_ManCi(pAig,iVar1), pGVar7 != (Gia_Obj_t *)0x0))) {
      uVar4 = Gia_ManAppendCi(p_03);
      pGVar7->Value = uVar4;
      iVar1 = iVar1 + 1;
    }
    if (uVar9 == 0) {
      for (iVar1 = 0; iVar1 < p_04->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(p_04,iVar1);
        pGVar7 = Gia_ManObj(pAig,iVar2);
        if (pGVar7 == (Gia_Obj_t *)0x0) break;
        if (((undefined1  [12])*pGVar7 & (undefined1  [12])0x9fffffff) !=
            (undefined1  [12])0x9fffffff) {
          __assert_fail("Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                        ,0x2f7,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
        }
        iVar2 = Gia_ObjIsPi(pAig,pGVar7);
        if (iVar2 == 0) {
          pGVar7->Value = 0;
        }
      }
    }
    else {
      for (iVar1 = 0; iVar1 < p_04->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(p_04,iVar1);
        pGVar7 = Gia_ManObj(pAig,iVar2);
        if (pGVar7 == (Gia_Obj_t *)0x0) break;
        if (((undefined1  [12])*pGVar7 & (undefined1  [12])0x9fffffff) !=
            (undefined1  [12])0x9fffffff) {
          __assert_fail("Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                        ,0x300,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
        }
        iVar2 = Gia_ObjIsPi(pAig,pGVar7);
        if (iVar2 == 0) {
          pGVar8 = Gia_ObjRoToRi(pAig,pGVar7);
          pGVar7->Value = pGVar8->Value;
        }
      }
    }
    for (iVar1 = 0; iVar1 < p_05->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(p_05,iVar1);
      pGVar7 = Gia_ManObj(pAig,iVar2);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      if (((int)(uint)*(undefined8 *)pGVar7 < 0) ||
         (((uint)*(undefined8 *)pGVar7 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                      ,0x321,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
      }
      iVar2 = Gia_ObjFanin0Copy(pGVar7);
      iVar3 = Gia_ObjFanin1Copy(pGVar7);
      uVar4 = Gia_ManHashAnd(p_03,iVar2,iVar3);
      pGVar7->Value = uVar4;
    }
    for (iVar1 = 0; iVar1 < p_06->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(p_06,iVar1);
      pGVar7 = Gia_ManObj(pAig,iVar2);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      if ((-1 < (int)(uint)*(undefined8 *)pGVar7) ||
         (((uint)*(undefined8 *)pGVar7 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                      ,0x326,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
      }
      iVar5 = Gia_ObjCioId(pGVar7);
      iVar2 = pAig->vCos->nSize;
      iVar3 = pAig->nRegs;
      uVar4 = Gia_ObjFanin0Copy(pGVar7);
      if (iVar5 < iVar2 - iVar3) {
        uVar4 = Gia_ManAppendCo(p_03,uVar4);
      }
      pGVar7->Value = uVar4;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFramesInit( Gia_Man_t * pAig, Gia_ParFra_t * pPars )
{
    int fUseAllPis = 1;
    Gia_Man_t * pFrames, * pTemp;
    Gia_ManFra_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vIns, * vAnds, * vOuts;
    int i, f;
    p = Gia_ManFraStart( pAig, pPars );
    Gia_ManFraSupports( p );
    pFrames = Gia_ManStart( Vec_VecSizeSize((Vec_Vec_t*)p->vIns)+
        Vec_VecSizeSize((Vec_Vec_t*)p->vAnds)+Vec_VecSizeSize((Vec_Vec_t*)p->vOuts) );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    Gia_ManHashAlloc( pFrames );
    Gia_ManConst0(pAig)->Value = 0;
    for ( f = 0; f < pPars->nFrames; f++ )
    {
        vIns  = (Vec_Int_t *)Vec_PtrEntry( p->vIns,  f );
        vAnds = (Vec_Int_t *)Vec_PtrEntry( p->vAnds, f );
        vOuts = (Vec_Int_t *)Vec_PtrEntry( p->vOuts, f );
        if ( pPars->fVerbose )
            printf( "Frame %3d : CI = %6d. AND = %6d. CO = %6d.\n", 
            f, Vec_IntSize(vIns), Vec_IntSize(vAnds), Vec_IntSize(vOuts) );
        if ( fUseAllPis )
        {
            Gia_ManForEachPi( pAig, pObj, i )
                pObj->Value = Gia_ManAppendCi( pFrames );
            if ( f == 0 )
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( !Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = 0;
                }
            }
            else
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( !Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ObjRoToRi(pAig, pObj)->Value;
                }
            }
        }
        else
        {
            if ( f == 0 )
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ManAppendCi( pFrames );
                    else
                        pObj->Value = 0;
                }
            }
            else
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ManAppendCi( pFrames );
                    else
                        pObj->Value = Gia_ObjRoToRi(pAig, pObj)->Value;
                }
            }
        }
        Gia_ManForEachObjVec( vAnds, pAig, pObj, i )
        {
            assert( Gia_ObjIsAnd(pObj) );
            pObj->Value = Gia_ManHashAnd( pFrames, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        Gia_ManForEachObjVec( vOuts, pAig, pObj, i )
        {
            assert( Gia_ObjIsCo(pObj) );
            if ( Gia_ObjIsPo(pAig, pObj) )
                pObj->Value = Gia_ManAppendCo( pFrames, Gia_ObjFanin0Copy(pObj) );
            else
                pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
    }
    Gia_ManFraStop( p );
    Gia_ManHashStop( pFrames );
    if ( Gia_ManCombMarkUsed(pFrames) < Gia_ManAndNum(pFrames) )
    {
        pFrames = Gia_ManDupMarked( pTemp = pFrames );
        if ( pPars->fVerbose )
            printf( "Before cleanup = %d nodes. After cleanup = %d nodes.\n", 
                Gia_ManAndNum(pTemp), Gia_ManAndNum(pFrames) );
        Gia_ManStop( pTemp );
    }
    else if ( pPars->fVerbose )
            printf( "Before cleanup = %d nodes. After cleanup = %d nodes.\n", 
                Gia_ManAndNum(pFrames), Gia_ManAndNum(pFrames) );
    return pFrames;
}